

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.h
# Opt level: O0

void __thiscall gulcalc::~gulcalc(gulcalc *this)

{
  gulcalc *this_local;
  
  if (this->ibuf_ != (uchar *)0x0) {
    operator_delete__(this->ibuf_);
  }
  if (this->corrbuf_ != (uchar *)0x0) {
    operator_delete__(this->corrbuf_);
  }
  if (this->cbuf_ != (uchar *)0x0) {
    operator_delete__(this->cbuf_);
  }
  std::vector<int,_std::allocator<int>_>::~vector(&this->mode1UsedCoverageIDs_);
  std::vector<prob_mean,_std::allocator<prob_mean>_>::~vector(&this->bin_lookup_);
  std::map<prob_mean,_int,_std::less<prob_mean>,_std::allocator<std::pair<const_prob_mean,_int>_>_>
  ::~map(&this->bin_map_);
  std::
  vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
  ::~vector(&this->mode1_stats_);
  std::
  vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
  ::~vector(&this->fullCorr_);
  std::
  vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
  ::~vector(&this->mode1_);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&this->cov_);
  gulcalcopts::~gulcalcopts(&this->opt_);
  return;
}

Assistant:

~gulcalc() {
		delete [] ibuf_;
		delete [] corrbuf_;
		delete [] cbuf_;
	}